

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzer.cpp
# Opt level: O1

void __thiscall EnrichableI2cAnalyzer::WorkerThread(EnrichableI2cAnalyzer *this)

{
  EnrichableAnalyzerSubprocess *this_00;
  U32 UVar1;
  AnalyzerChannelData *pAVar2;
  allocator local_39;
  string local_38;
  
  UVar1 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar1;
  this->mNeedAddress = true;
  this_00 = (this->mSubprocess)._M_ptr;
  std::__cxx11::string::string
            ((string *)&local_38,((this->mSettings)._M_ptr)->mParserCommand,&local_39);
  EnrichableAnalyzerSubprocess::SetParserCommand(this_00,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  EnrichableAnalyzerSubprocess::Start((this->mSubprocess)._M_ptr);
  pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mSda = pAVar2;
  pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mScl = pAVar2;
  AdvanceToStartBit(this);
  AnalyzerChannelData::AdvanceToNextEdge();
  do {
    GetByte(this);
    Analyzer::CheckIfThreadShouldExit();
  } while( true );
}

Assistant:

void EnrichableI2cAnalyzer::WorkerThread()
{
	mSampleRateHz = GetSampleRate();
	mNeedAddress = true;

	mSubprocess->SetParserCommand(mSettings->mParserCommand);
	mSubprocess->Start();

	mSda = GetAnalyzerChannelData( mSettings->mSdaChannel );
	mScl = GetAnalyzerChannelData( mSettings->mSclChannel );

	AdvanceToStartBit(); 
	mScl->AdvanceToNextEdge(); //now scl is low.

	for( ; ; )
	{
		GetByte();
		CheckIfThreadShouldExit();
	}

	mSubprocess->Stop();
}